

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_statistics.cpp
# Opt level: O2

Value * duckdb::ParquetStatisticsUtils::ConvertValue
                  (Value *__return_storage_ptr__,LogicalType *type,ParquetColumnSchema *schema_ele,
                  string *stats)

{
  bool bVar1;
  LogicalType LStack_f8;
  string error;
  LogicalType local_c0;
  Value result;
  Value stats_val;
  
  LogicalType::LogicalType(&local_c0,SQLNULL);
  Value::Value(&result,&local_c0);
  LogicalType::~LogicalType(&local_c0);
  error._M_dataplus._M_p = (pointer)&error.field_2;
  error._M_string_length = 0;
  error.field_2._M_local_buf[0] = '\0';
  ConvertValueInternal(&stats_val,type,schema_ele,stats);
  bVar1 = Value::DefaultTryCastAs(&stats_val,type,&result,&error,false);
  if (bVar1) {
    Value::Value(__return_storage_ptr__,&result);
  }
  else {
    LogicalType::LogicalType(&LStack_f8,type);
    Value::Value(__return_storage_ptr__,&LStack_f8);
    LogicalType::~LogicalType(&LStack_f8);
  }
  Value::~Value(&stats_val);
  ::std::__cxx11::string::~string((string *)&error);
  Value::~Value(&result);
  return __return_storage_ptr__;
}

Assistant:

Value ParquetStatisticsUtils::ConvertValue(const LogicalType &type, const ParquetColumnSchema &schema_ele,
                                           const std::string &stats) {
	Value result;
	string error;
	auto stats_val = ConvertValueInternal(type, schema_ele, stats);
	if (!stats_val.DefaultTryCastAs(type, result, &error)) {
		return Value(type);
	}
	return result;
}